

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_gen_code_sparc_cold_5(void)

{
  byte *pbVar1;
  undefined1 *puVar2;
  uint uVar3;
  long *in_RDX;
  uint in_ESI;
  uint in_EDI;
  
  uVar3 = in_ESI >> 3 & 1 | in_EDI >> 1 & 4;
  if (uVar3 != 0) {
    pbVar1 = (byte *)*in_RDX;
    *in_RDX = (long)(pbVar1 + 1);
    *pbVar1 = (byte)uVar3 | 0x40;
  }
  puVar2 = (undefined1 *)*in_RDX;
  *in_RDX = (long)(puVar2 + 1);
  *puVar2 = 0x8b;
  pbVar1 = (byte *)*in_RDX;
  *in_RDX = (long)(pbVar1 + 1);
  *pbVar1 = ((byte)in_ESI & 7) + (char)in_EDI * '\b' | 0xc0;
  return;
}

Assistant:

static void tcg_out_opc(TCGContext *s, int opc, int r, int rm, int x)
{
    int rex;

    if (opc & P_GS) {
        tcg_out8(s, 0x65);
    }
    if (opc & P_DATA16) {
        /* We should never be asking for both 16 and 64-bit operation.  */
        tcg_debug_assert((opc & P_REXW) == 0);
        tcg_out8(s, 0x66);
    }
    if (opc & P_SIMDF3) {
        tcg_out8(s, 0xf3);
    } else if (opc & P_SIMDF2) {
        tcg_out8(s, 0xf2);
    }

    rex = 0;
    rex |= (opc & P_REXW) ? 0x8 : 0x0;  /* REX.W */
    rex |= (r & 8) >> 1;                /* REX.R */
    rex |= (x & 8) >> 2;                /* REX.X */
    rex |= (rm & 8) >> 3;               /* REX.B */

    /* P_REXB_{R,RM} indicates that the given register is the low byte.
       For %[abcd]l we need no REX prefix, but for %{si,di,bp,sp}l we do,
       as otherwise the encoding indicates %[abcd]h.  Note that the values
       that are ORed in merely indicate that the REX byte must be present;
       those bits get discarded in output.  */
    rex |= opc & (r >= 4 ? P_REXB_R : 0);
    rex |= opc & (rm >= 4 ? P_REXB_RM : 0);

    if (rex) {
        tcg_out8(s, (uint8_t)(rex | 0x40));
    }

    if (opc & (P_EXT | P_EXT38 | P_EXT3A)) {
        tcg_out8(s, 0x0f);
        if (opc & P_EXT38) {
            tcg_out8(s, 0x38);
        } else if (opc & P_EXT3A) {
            tcg_out8(s, 0x3a);
        }
    }

    tcg_out8(s, opc);
}